

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckDeclarationOrder.cxx
# Opt level: O3

bool __thiscall
kws::Parser::CheckDeclarationOrder
          (Parser *this,size_t posPublic,size_t posProtected,size_t posPrivate)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  byte bVar4;
  char *__s;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t publicFirst;
  size_t privateFirst;
  size_t protectedFirst;
  Error error;
  size_t privateLast;
  size_t protectedLast;
  size_t publicLast;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  value_type local_98;
  string *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  this->m_TestsDone[8] = true;
  local_a0 = posPrivate;
  __s = (char *)operator_new__(0xff);
  builtin_strncpy(__s,"Declaration order should match ",0x20);
  pcVar2 = (char *)this->m_TestsDescription[8]._M_string_length;
  strlen(__s);
  sVar8 = local_a0;
  local_60 = this->m_TestsDescription + 8;
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 8),0,pcVar2,(ulong)__s);
  local_58 = posProtected;
  local_50 = posPublic;
  if ((((posProtected < posPublic && sVar8 < posProtected) ||
       (posPublic < posProtected && posProtected < sVar8)) ||
      (sVar8 < posPublic && posProtected < sVar8)) || (posPublic < sVar8 && posProtected < sVar8)) {
    std::__cxx11::string::append((char *)local_60);
  }
  operator_delete__(__s);
  sVar8 = 0;
  while( true ) {
    FindPublicArea(this,&local_b8,&local_38,sVar8);
    sVar5 = FindEndOfClass(this,local_b8);
    sVar6 = FindOpeningChar(this,'}','{',sVar5,true);
    sVar8 = local_a0;
    if (((local_b8 == 0xffffffffffffffff) || (local_b8 == 99999999)) ||
       (sVar6 <= local_b8 && local_b8 <= sVar5)) break;
    sVar8 = local_b8 + 1;
  }
  sVar5 = 0;
  while( true ) {
    FindProtectedArea(this,&local_a8,&local_40,sVar5);
    sVar5 = FindEndOfClass(this,local_a8);
    sVar5 = FindOpeningChar(this,'}','{',sVar5,true);
    if (((local_a8 == 0xffffffffffffffff) || (local_a8 == 99999999)) || (sVar5 == sVar6)) break;
    sVar5 = local_a8 + 1;
  }
  sVar5 = 0;
  while( true ) {
    FindPrivateArea(this,&local_b0,&local_48,sVar5);
    sVar5 = FindEndOfClass(this,local_b0);
    sVar7 = FindOpeningChar(this,'}','{',sVar5,true);
    sVar3 = local_50;
    sVar5 = local_58;
    if (((local_b0 == 0xffffffffffffffff) || (local_b0 == 99999999)) || (sVar7 == sVar6)) break;
    sVar5 = local_b0 + 1;
  }
  if (local_b8 < local_a8 && ((local_b8 != 99999999 && local_a8 != 99999999) && local_58 < local_50)
     ) {
    local_98.description._M_dataplus._M_p = (pointer)&local_98.description.field_2;
    local_98.description._M_string_length = 0;
    local_98.description.field_2._M_local_buf[0] = '\0';
    local_98.line = GetLineNumber(this,local_b8,true);
    local_98.line2 = GetLineNumber(this,local_b8,true);
    local_98.number = 8;
    std::__cxx11::string::_M_replace
              ((ulong)&local_98.description,0,(char *)local_98.description._M_string_length,0x176668
              );
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_98);
  }
  else {
    if ((local_b8 <= local_a8 || local_58 <= local_50) ||
        (local_a8 == 99999999 || local_b8 == 99999999)) {
      bVar4 = 0;
      goto LAB_00150e59;
    }
    local_98.description._M_dataplus._M_p = (pointer)&local_98.description.field_2;
    local_98.description._M_string_length = 0;
    local_98.description.field_2._M_local_buf[0] = '\0';
    local_98.line = GetLineNumber(this,local_a8,true);
    local_98.line2 = GetLineNumber(this,local_a8,true);
    local_98.number = 8;
    std::__cxx11::string::_M_replace
              ((ulong)&local_98.description,0,(char *)local_98.description._M_string_length,0x176688
              );
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.description._M_dataplus._M_p != &local_98.description.field_2) {
    operator_delete(local_98.description._M_dataplus._M_p);
  }
  bVar4 = 1;
LAB_00150e59:
  if (local_b0 < local_a8 && ((local_b0 != 99999999 && local_a8 != 99999999) && sVar5 < sVar8)) {
    paVar1 = &local_98.description.field_2;
    local_98.description._M_string_length = 0;
    local_98.description.field_2._M_local_buf[0] = '\0';
    local_98.description._M_dataplus._M_p = (pointer)paVar1;
    local_98.line = GetLineNumber(this,local_b0,true);
    local_98.line2 = GetLineNumber(this,local_b0,true);
    local_98.number = 8;
    std::__cxx11::string::_M_replace
              ((ulong)&local_98.description,0,(char *)local_98.description._M_string_length,0x1766a8
              );
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.description._M_dataplus._M_p);
    }
    bVar4 = 1;
    sVar8 = local_a0;
  }
  if (local_b8 < local_b0 && ((local_b8 != 99999999 && local_b0 != 99999999) && sVar8 < sVar3)) {
    paVar1 = &local_98.description.field_2;
    local_98.description._M_string_length = 0;
    local_98.description.field_2._M_local_buf[0] = '\0';
    local_98.description._M_dataplus._M_p = (pointer)paVar1;
    local_98.line = GetLineNumber(this,local_b8,true);
    local_98.line2 = GetLineNumber(this,local_b8,true);
    local_98.number = 8;
    std::__cxx11::string::_M_replace
              ((ulong)&local_98.description,0,(char *)local_98.description._M_string_length,0x1766c9
              );
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.description._M_dataplus._M_p);
    }
    bVar4 = 1;
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool Parser::CheckDeclarationOrder(size_t posPublic, size_t posProtected, size_t posPrivate)
{
  m_TestsDone[DECL_ORDER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Declaration order should match ");
  m_TestsDescription[DECL_ORDER] = val;

  if(posPublic>posProtected && posProtected>posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Private/Protected/Public";
    }
  else if(posPublic<posProtected && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Public/Protected/Private";
    }
  else if(posPublic>posPrivate && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Protected/Private/Public";
    } 
  else if(posPublic<posPrivate && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Protected/Public/Private";
    }

  delete [] val;

  size_t publicFirst;
  size_t publicLast;
  this->FindPublicArea(publicFirst,publicLast);
  
  size_t class_end = this->FindEndOfClass(publicFirst);
  size_t class_beg = this->FindOpeningChar('}','{',class_end,true);

  // Find the first public declaration
  while(publicFirst!=std::string::npos && publicFirst!=MAX_CHAR && (publicFirst<class_beg || publicFirst>class_end))
    {
    this->FindPublicArea(publicFirst,publicLast,publicFirst+1);
    class_end = this->FindEndOfClass(publicFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
  
  // Currently checking only one class per file (do a loop in the future)
  size_t currentclass = class_beg;

  size_t protectedFirst;
  size_t protectedLast;
  this->FindProtectedArea(protectedFirst,protectedLast);

  class_end = this->FindEndOfClass(protectedFirst);
  class_beg = this->FindOpeningChar('}','{',class_end,true);
  while(protectedFirst!=std::string::npos && protectedFirst!=MAX_CHAR &&class_beg != currentclass)
    {
    this->FindProtectedArea(protectedFirst,protectedLast,protectedFirst+1);
    class_end = this->FindEndOfClass(protectedFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
  
  size_t privateFirst;
  size_t privateLast;
  this->FindPrivateArea(privateFirst,privateLast);

  class_end = this->FindEndOfClass(privateFirst);
  class_beg = this->FindOpeningChar('}','{',class_end,true);

  while(privateFirst!=std::string::npos && privateFirst!=MAX_CHAR && class_beg != currentclass)
    {
    this->FindPrivateArea(privateFirst,privateLast,privateFirst+1);    
    class_end = this->FindEndOfClass(privateFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
 
  bool hasError = false;

  // public v.s protected
  if( (posPublic > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (protectedFirst > publicFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(publicFirst,true);
    error.line2 = this->GetLineNumber(publicFirst,true);
    error.number = DECL_ORDER;
    error.description = "Public defined before Protected";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPublic < posProtected)
      && (protectedFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (protectedFirst < publicFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(protectedFirst,true);
     error.line2 = this->GetLineNumber(protectedFirst,true);
     error.number = DECL_ORDER;
     error.description = "Protected defined before Public";
     m_ErrorList.push_back(error);
     hasError = true;
     }

  // protected v.s. private
  if( (posPrivate > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (privateFirst != MAX_CHAR)
      && (protectedFirst > privateFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(privateFirst,true);
    error.line2 = this->GetLineNumber(privateFirst,true);
    error.number = DECL_ORDER;
    error.description = "Private defined before Protected";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPrivate > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (privateFirst != MAX_CHAR)
      && (protectedFirst > privateFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(protectedFirst,true);
     error.line2 = this->GetLineNumber(protectedFirst,true);
     error.number = DECL_ORDER;
     error.description = "Protected defined before Private";
     m_ErrorList.push_back(error);
     hasError = true;
     }

  // Public v.s. Private
  if( (posPublic > posPrivate)
      && (privateFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (privateFirst > publicFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(publicFirst,true);
    error.line2 = this->GetLineNumber(publicFirst,true);
    error.number = DECL_ORDER;
    error.description = "Public defined before Private";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPublic > posPrivate)
      && (privateFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (privateFirst > publicFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(privateFirst,true);
     error.line2 = this->GetLineNumber(privateFirst,true);
     error.number = DECL_ORDER;
     error.description = "Private defined before Public";
     m_ErrorList.push_back(error);
     hasError = true;
     }
     
  return !hasError;
}